

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O2

void ApplyClampedForce(Node *n,btVector3 *f,btScalar dt)

{
  btScalar bVar1;
  btScalar bVar2;
  btScalar dtim;
  float local_4c;
  btVector3 local_48;
  btVector3 local_38;
  btVector3 local_28;
  
  local_4c = dt * n->m_im;
  local_48 = operator*(f,&local_4c);
  bVar1 = btVector3::length2(&local_48);
  bVar2 = btVector3::length2(&n->m_v);
  if (bVar1 <= bVar2) {
    btVector3::operator+=(&n->m_f,f);
  }
  else {
    local_38 = btVector3::normalized(f);
    local_28 = ProjectOnAxis(&n->m_v,&local_38);
    local_48 = operator/(&local_28,&local_4c);
    btVector3::operator-=(&n->m_f,&local_48);
  }
  return;
}

Assistant:

static inline void			ApplyClampedForce(	btSoftBody::Node& n,
											  const btVector3& f,
											  btScalar dt)
{
	const btScalar	dtim=dt*n.m_im;
	if((f*dtim).length2()>n.m_v.length2())
	{/* Clamp	*/ 
		n.m_f-=ProjectOnAxis(n.m_v,f.normalized())/dtim;						
	}
	else
	{/* Apply	*/ 
		n.m_f+=f;
	}
}